

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.hh
# Opt level: O2

shared_ptr<kratos::Stmt> __thiscall kratos::Generator::get_stmt(Generator *this,uint32_t index)

{
  long lVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined4 in_register_00000034;
  shared_ptr<kratos::Stmt> sVar2;
  
  lVar1 = *(long *)(CONCAT44(in_register_00000034,index) + 0x1f8);
  if (((ulong)in_RDX._M_pi & 0xffffffff) <
      (ulong)(*(long *)(CONCAT44(in_register_00000034,index) + 0x200) - lVar1 >> 4)) {
    std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)
               (lVar1 + ((ulong)in_RDX._M_pi & 0xffffffff) * 0x10));
    in_RDX._M_pi = extraout_RDX;
  }
  else {
    (this->super_IRNode)._vptr_IRNode = (_func_int **)0x0;
    (this->super_IRNode).fn_name_ln.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  sVar2.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar2.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<kratos::Stmt>)
         sVar2.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Stmt> get_stmt(uint32_t index) {
        return index < stmts_.size() ? stmts_[index] : nullptr;
    }